

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

void __thiscall
std::tr1::
tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
::tuple(tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
        *this,tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
              *t)

{
  MatcherInterface<char_*> *pMVar1;
  MatcherInterface<unsigned_long> *pMVar2;
  linked_ptr_internal *plVar3;
  
  (this->f0_).super_MatcherBase<char_*>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002a1660
  ;
  pMVar1 = (t->f0_).super_MatcherBase<char_*>.impl_.value_;
  (this->f0_).super_MatcherBase<char_*>.impl_.value_ = pMVar1;
  plVar3 = &(this->f0_).super_MatcherBase<char_*>.impl_.link_;
  if (pMVar1 == (MatcherInterface<char_*> *)0x0) {
    plVar3->next_ = plVar3;
  }
  else {
    testing::internal::linked_ptr_internal::join
              (plVar3,&(t->f0_).super_MatcherBase<char_*>.impl_.link_);
  }
  (this->f0_).super_MatcherBase<char_*>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002a3978
  ;
  (this->f1_).super_MatcherBase<unsigned_long>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002a1350;
  pMVar2 = (t->f1_).super_MatcherBase<unsigned_long>.impl_.value_;
  (this->f1_).super_MatcherBase<unsigned_long>.impl_.value_ = pMVar2;
  plVar3 = &(this->f1_).super_MatcherBase<unsigned_long>.impl_.link_;
  if (pMVar2 == (MatcherInterface<unsigned_long> *)0x0) {
    plVar3->next_ = plVar3;
  }
  else {
    testing::internal::linked_ptr_internal::join
              (plVar3,&(t->f1_).super_MatcherBase<unsigned_long>.impl_.link_);
  }
  (this->f1_).super_MatcherBase<unsigned_long>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002a14c8;
  return;
}

Assistant:

tuple(const tuple& t) : f0_(t.f0_), f1_(t.f1_) {}